

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sim.cc
# Opt level: O2

void kratos::DependencyVisitor::compute_linked_dep
               (VarSlice *slice,
               unordered_map<const_kratos::Var_*,_std::unordered_map<unsigned_int,_kratos::Var_*,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_kratos::Var_*>_>_>,_std::hash<const_kratos::Var_*>,_std::equal_to<const_kratos::Var_*>,_std::allocator<std::pair<const_kratos::Var_*const,_std::unordered_map<unsigned_int,_kratos::Var_*,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_kratos::Var_*>_>_>_>_>_>
               *linked_dep)

{
  long *plVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  undefined4 extraout_var;
  _Hashtable<unsigned_int,std::pair<unsigned_int_const,kratos::Var*>,std::allocator<std::pair<unsigned_int_const,kratos::Var*>>,std::__detail::_Select1st,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
  *p_Var5;
  key_type local_48;
  Var *root;
  VarSlice *slice_local;
  
  root = &slice->super_Var;
  uVar2 = (*(slice->super_Var).super_IRNode._vptr_IRNode[0x25])();
  uVar3 = (*(slice->super_Var).super_IRNode._vptr_IRNode[0x26])(slice);
  iVar4 = (*(slice->super_Var).super_IRNode._vptr_IRNode[0x29])(slice);
  local_48 = (key_type)CONCAT44(extraout_var,iVar4);
  while (slice_local._4_4_ = uVar3, uVar3 <= uVar2) {
    p_Var5 = (_Hashtable<unsigned_int,std::pair<unsigned_int_const,kratos::Var*>,std::allocator<std::pair<unsigned_int_const,kratos::Var*>>,std::__detail::_Select1st,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
              *)std::__detail::
                _Map_base<const_kratos::Var_*,_std::pair<const_kratos::Var_*const,_std::unordered_map<unsigned_int,_kratos::Var_*,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_kratos::Var_*>_>_>_>,_std::allocator<std::pair<const_kratos::Var_*const,_std::unordered_map<unsigned_int,_kratos::Var_*,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_kratos::Var_*>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<const_kratos::Var_*>,_std::hash<const_kratos::Var_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                ::operator[]((_Map_base<const_kratos::Var_*,_std::pair<const_kratos::Var_*const,_std::unordered_map<unsigned_int,_kratos::Var_*,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_kratos::Var_*>_>_>_>,_std::allocator<std::pair<const_kratos::Var_*const,_std::unordered_map<unsigned_int,_kratos::Var_*,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_kratos::Var_*>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<const_kratos::Var_*>,_std::hash<const_kratos::Var_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                              *)linked_dep,&local_48);
    std::
    _Hashtable<unsigned_int,std::pair<unsigned_int_const,kratos::Var*>,std::allocator<std::pair<unsigned_int_const,kratos::Var*>>,std::__detail::_Select1st,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
    ::_M_emplace<unsigned_int&,kratos::VarSlice*&>(p_Var5,(long)&slice_local + 4,&root);
    uVar3 = slice_local._4_4_ + 1;
  }
  iVar4 = (*(root->super_IRNode)._vptr_IRNode[0x2b])();
  if ((char)iVar4 != '\0') {
    plVar1 = (long *)root[1].super_IRNode.comment._M_dataplus._M_p;
    uVar3 = (**(code **)(*plVar1 + 0x128))(plVar1);
    uVar2 = (**(code **)(*plVar1 + 0x130))(plVar1);
    local_48 = (key_type)(**(code **)(*plVar1 + 0x148))(plVar1);
    while (uVar2 <= uVar3) {
      slice_local._4_4_ = uVar2;
      p_Var5 = (_Hashtable<unsigned_int,std::pair<unsigned_int_const,kratos::Var*>,std::allocator<std::pair<unsigned_int_const,kratos::Var*>>,std::__detail::_Select1st,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                *)std::__detail::
                  _Map_base<const_kratos::Var_*,_std::pair<const_kratos::Var_*const,_std::unordered_map<unsigned_int,_kratos::Var_*,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_kratos::Var_*>_>_>_>,_std::allocator<std::pair<const_kratos::Var_*const,_std::unordered_map<unsigned_int,_kratos::Var_*,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_kratos::Var_*>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<const_kratos::Var_*>,_std::hash<const_kratos::Var_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                  ::operator[]((_Map_base<const_kratos::Var_*,_std::pair<const_kratos::Var_*const,_std::unordered_map<unsigned_int,_kratos::Var_*,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_kratos::Var_*>_>_>_>,_std::allocator<std::pair<const_kratos::Var_*const,_std::unordered_map<unsigned_int,_kratos::Var_*,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_kratos::Var_*>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<const_kratos::Var_*>,_std::hash<const_kratos::Var_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                *)linked_dep,&local_48);
      std::
      _Hashtable<unsigned_int,std::pair<unsigned_int_const,kratos::Var*>,std::allocator<std::pair<unsigned_int_const,kratos::Var*>>,std::__detail::_Select1st,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
      ::_M_emplace<unsigned_int&,kratos::VarSlice*&>(p_Var5,(long)&slice_local + 4,&root);
      uVar2 = slice_local._4_4_ + 1;
    }
  }
  return;
}

Assistant:

static void compute_linked_dep(
        VarSlice *slice,
        std::unordered_map<const Var *, std::unordered_map<uint32_t, Var *>> &linked_dep) {
        auto var_high = slice->var_high();
        auto var_low = slice->var_low();
        auto *root = slice->get_var_root_parent();
        for (uint32_t i = var_low; i <= var_high; i++) {
            linked_dep[root].emplace(i, slice);
        }
        // if indexed by a var
        if (slice->sliced_by_var()) {
            auto *var_slice = reinterpret_cast<VarVarSlice *>(slice);
            auto *p = var_slice->sliced_var();
            var_high = p->var_high();
            var_low = p->var_low();
            root = p->get_var_root_parent();
            for (uint32_t i = var_low; i <= var_high; i++) {
                linked_dep[root].emplace(i, slice);
            }
        }
    }